

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264e_dpb.c
# Opt level: O2

void h264e_dpb_build_list(H264eDpb *dpb,EncCpbStatus *cpb)

{
  H264eDpbFrm **list;
  H264eDpbFrm **list_00;
  ushort uVar1;
  ushort uVar2;
  uint uVar3;
  H264eDpbFrm *pHVar4;
  H264eDpbFrm *pHVar5;
  int iVar6;
  ulong uVar7;
  char *fmt;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  long lVar11;
  EncFrmStatus *in_stack_ffffffffffffff88;
  EncFrmStatus *frm;
  undefined8 uVar12;
  undefined4 uVar13;
  uint local_58;
  uint local_54;
  H264eRplmo local_48;
  H264eDpbFrm **local_38;
  
  if ((h264e_debug & 0x100) != 0) {
    _mpp_log_l(4,"h264e_dpb","enter %p\n","h264e_dpb_build_list",dpb);
  }
  dpb->list[0xe] = (H264eDpbFrm *)0x0;
  dpb->list[0xf] = (H264eDpbFrm *)0x0;
  dpb->list[0xc] = (H264eDpbFrm *)0x0;
  dpb->list[0xd] = (H264eDpbFrm *)0x0;
  dpb->list[10] = (H264eDpbFrm *)0x0;
  dpb->list[0xb] = (H264eDpbFrm *)0x0;
  dpb->list[8] = (H264eDpbFrm *)0x0;
  dpb->list[9] = (H264eDpbFrm *)0x0;
  dpb->list[6] = (H264eDpbFrm *)0x0;
  dpb->list[7] = (H264eDpbFrm *)0x0;
  dpb->list[4] = (H264eDpbFrm *)0x0;
  dpb->list[5] = (H264eDpbFrm *)0x0;
  dpb->list[2] = (H264eDpbFrm *)0x0;
  dpb->list[3] = (H264eDpbFrm *)0x0;
  dpb->list[0] = (H264eDpbFrm *)0x0;
  dpb->list[1] = (H264eDpbFrm *)0x0;
  if (((ulong)cpb->curr & 0x10) == 0) {
    if ((h264e_debug >> 9 & 1) != 0) {
      _mpp_log_l(4,"h264e_dpb","cpb init scaning start\n","h264e_dpb_build_list");
    }
    local_38 = dpb->list;
    list = dpb->ltref;
    list_00 = dpb->stref;
    lVar11 = 0;
    local_54 = 0;
    local_58 = 0;
    for (uVar10 = 0; uVar13 = (undefined4)((ulong)in_stack_ffffffffffffff88 >> 0x20), uVar10 != 8;
        uVar10 = uVar10 + 1) {
      if ((cpb->init[uVar10].val & 1) != 0) {
        if ((cpb->init[uVar10].val & 0x40) != 0) {
          in_stack_ffffffffffffff88 = (EncFrmStatus *)CONCAT44(uVar13,0xfc);
          _mpp_log_l(2,"h264e_dpb","Assertion %s failed at %s:%d\n",(char *)0x0,"!frm->is_non_ref",
                     "h264e_dpb_build_list",in_stack_ffffffffffffff88);
          if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_0022ae22;
        }
        if ((h264e_debug & 0x200) != 0) {
          uVar7 = cpb->init[uVar10].val;
          in_stack_ffffffffffffff88 =
               (EncFrmStatus *)
               (CONCAT44((int)((ulong)in_stack_ffffffffffffff88 >> 0x20),(int)uVar7) &
               0xffffffff00000001);
          _mpp_log_l(4,"h264e_dpb","idx %d frm %d valid %d is_non_ref %d lt_ref %d\n",
                     "h264e_dpb_build_list",uVar10 & 0xffffffff,uVar7 >> 0x30,
                     in_stack_ffffffffffffff88,(uint)(uVar7 >> 6) & 1,(uint)(uVar7 >> 7) & 1);
        }
        frm = (EncFrmStatus *)((long)cpb->init + lVar11);
        pHVar5 = find_cpb_frame(dpb,frm);
        if (((ulong)cpb->init[uVar10] & 0x80) == 0) {
          uVar9 = local_58 + 1;
          list_00[(int)local_58] = pHVar5;
          pHVar5->status = cpb->init[uVar10];
          local_58 = uVar9;
          if ((h264e_debug & 0x200) != 0) {
            fmt = "found st %d st_size %d %p\n";
LAB_0022a954:
            _mpp_log_l(4,"h264e_dpb",fmt,"h264e_dpb_build_list",uVar10 & 0xffffffff,(ulong)uVar9,frm
                      );
            in_stack_ffffffffffffff88 = frm;
          }
        }
        else {
          uVar9 = local_54 + 1;
          list[(int)local_54] = pHVar5;
          pHVar5->status = cpb->init[uVar10];
          local_54 = uVar9;
          if ((h264e_debug & 0x200) != 0) {
            fmt = "found lt %d lt_size %d %p\n";
            goto LAB_0022a954;
          }
        }
      }
      lVar11 = lVar11 + 8;
    }
    if ((h264e_debug >> 9 & 1) != 0) {
      _mpp_log_l(4,"h264e_dpb","cpb init scaning done\n","h264e_dpb_build_list");
    }
    if ((h264e_debug >> 8 & 1) != 0) {
      uVar12 = CONCAT44(uVar13,local_54);
      _mpp_log_l(4,"h264e_dpb","dpb_size %d st_size %d lt_size %d\n","h264e_dpb_build_list",
                 (ulong)(uint)dpb->dpb_size,(ulong)local_58,uVar12);
      uVar13 = (undefined4)((ulong)uVar12 >> 0x20);
    }
    if (1 < (int)local_58) {
      if ((h264e_debug & 0x200) != 0) {
        _mpp_log_l(4,"h264e_dpb","dpb st list before sort\n","h264e_dpb_build_list");
        h264e_dpb_dump_listX(list_00,local_58);
      }
      qsort(list_00,(ulong)local_58,8,cmp_st_list);
      if ((h264e_debug & 0x200) != 0) {
        _mpp_log_l(4,"h264e_dpb","dpb st list after  sort\n","h264e_dpb_build_list");
        h264e_dpb_dump_listX(list_00,local_58);
      }
    }
    if (1 < (int)local_54) {
      if ((h264e_debug & 0x200) != 0) {
        _mpp_log_l(4,"h264e_dpb","dpb lt list before sort\n","h264e_dpb_build_list");
        h264e_dpb_dump_listX(list,local_54);
      }
      qsort(list,(ulong)local_54,8,cmp_lt_list);
      if ((h264e_debug & 0x200) != 0) {
        _mpp_log_l(4,"h264e_dpb","dpb lt list after  sort\n","h264e_dpb_build_list");
        h264e_dpb_dump_listX(list,local_54);
      }
    }
    local_38[0xe] = (H264eDpbFrm *)0x0;
    local_38[0xf] = (H264eDpbFrm *)0x0;
    local_38[0xc] = (H264eDpbFrm *)0x0;
    local_38[0xd] = (H264eDpbFrm *)0x0;
    local_38[10] = (H264eDpbFrm *)0x0;
    local_38[0xb] = (H264eDpbFrm *)0x0;
    local_38[8] = (H264eDpbFrm *)0x0;
    local_38[9] = (H264eDpbFrm *)0x0;
    local_38[6] = (H264eDpbFrm *)0x0;
    local_38[7] = (H264eDpbFrm *)0x0;
    local_38[4] = (H264eDpbFrm *)0x0;
    local_38[5] = (H264eDpbFrm *)0x0;
    local_38[2] = (H264eDpbFrm *)0x0;
    local_38[3] = (H264eDpbFrm *)0x0;
    *local_38 = (H264eDpbFrm *)0x0;
    local_38[1] = (H264eDpbFrm *)0x0;
    uVar7 = 0;
    uVar10 = 0;
    if (0 < (int)local_58) {
      uVar10 = (ulong)local_58;
    }
    for (; uVar10 != uVar7; uVar7 = uVar7 + 1) {
      dpb->list[uVar7] = dpb->stref[uVar7];
    }
    uVar7 = 0;
    uVar8 = 0;
    if (0 < (int)local_54) {
      uVar8 = (ulong)local_54;
    }
    for (; uVar8 != uVar7; uVar7 = uVar7 + 1) {
      dpb->list[uVar10 + uVar7] = list[uVar7];
    }
    dpb->st_size = local_58;
    dpb->lt_size = local_54;
    if (dpb->dpb_size < (int)(local_58 + local_54)) {
      uVar12 = CONCAT44(uVar13,0x139);
      _mpp_log_l(2,"h264e_dpb","Assertion %s failed at %s:%d\n",(char *)0x0,
                 "dpb->dpb_size >= st_size + lt_size","h264e_dpb_build_list",uVar12);
      uVar13 = (undefined4)((ulong)uVar12 >> 0x20);
      if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_0022ae22;
    }
    if ((h264e_debug & 0x200) != 0) {
      h264e_dpb_dump_list(dpb);
    }
    h264e_reorder_wr_rewind(dpb->reorder);
    if (dpb->st_size + dpb->lt_size == 0) {
      if ((h264e_debug & 0x200) != 0) {
        _mpp_log_l(4,"h264e_dpb","refer NULL\n","h264e_dpb_build_list");
      }
    }
    else {
      pHVar5 = dpb->curr;
      pHVar4 = dpb->refr;
      uVar1 = *(ushort *)((long)&pHVar4->status + 6);
      uVar2 = *(ushort *)((long)&dpb->list[0]->status + 6);
      if ((h264e_debug & 0x200) != 0) {
        uVar12 = CONCAT44(uVar13,(uint)uVar1);
        _mpp_log_l(4,"h264e_dpb","refer curr %d def %d set %d reorder %d\n","h264e_dpb_build_list",
                   (ulong)*(ushort *)((long)&pHVar5->status + 6),(ulong)uVar2,uVar12,
                   (uint)((ulong)uVar2 != (ulong)uVar1));
        uVar13 = (undefined4)((ulong)uVar12 >> 0x20);
      }
      if ((uint)uVar2 != (uint)uVar1) {
        uVar10 = (pHVar4->status).val;
        if ((h264e_debug & 0x200) != 0) {
          _mpp_log_l(4,"h264e_dpb","reorder to frm %d\n","h264e_dpb_build_list",uVar10 >> 0x30);
          uVar10 = (pHVar4->status).val;
        }
        uVar9 = (uint)uVar10;
        if ((uVar10 & 0x40) != 0) {
          uVar12 = CONCAT44(uVar13,0x153);
          _mpp_log_l(2,"h264e_dpb","Assertion %s failed at %s:%d\n",(char *)0x0,
                     "!refr->status.is_non_ref","h264e_dpb_build_list",uVar12);
          uVar13 = (undefined4)((ulong)uVar12 >> 0x20);
          if ((mpp_debug._3_1_ & 0x10) != 0) {
LAB_0022ae22:
            abort();
          }
          uVar9 = (uint)(pHVar4->status).val;
        }
        if ((char)uVar9 < '\0') {
          local_48.modification_of_pic_nums_idc = 2;
          local_48.long_term_pic_idx = uVar9 >> 8 & 0xf;
          if ((h264e_debug & 0x200) != 0) {
            _mpp_log_l(4,"h264e_dpb","reorder lt idx %d \n","h264e_dpb_build_list");
          }
        }
        else {
          uVar9 = pHVar5->frame_num;
          uVar3 = pHVar4->frame_num;
          iVar6 = uVar9 - uVar3;
          local_48.modification_of_pic_nums_idc = (RK_S32)(iVar6 == 0 || (int)uVar9 < (int)uVar3);
          local_48.abs_diff_pic_num_minus1 = -iVar6;
          if (0 < iVar6) {
            local_48.abs_diff_pic_num_minus1 = iVar6;
          }
          local_48.abs_diff_pic_num_minus1 = local_48.abs_diff_pic_num_minus1 + -1;
          if ((h264e_debug & 0x200) != 0) {
            _mpp_log_l(4,"h264e_dpb","reorder st cur %d refr %d diff - 1 %d\n",
                       "h264e_dpb_build_list",(ulong)uVar9,(ulong)uVar3,
                       CONCAT44(uVar13,local_48.abs_diff_pic_num_minus1));
          }
        }
        h264e_reorder_wr_op(dpb->reorder,&local_48);
      }
    }
    if ((h264e_debug & 0x100) != 0) {
      _mpp_log_l(4,"h264e_dpb","leave %p\n","h264e_dpb_build_list",dpb);
    }
  }
  else if ((h264e_debug >> 8 & 1) != 0) {
    _mpp_log_l(4,"h264e_dpb","leave %p\n","h264e_dpb_build_list",dpb);
    return;
  }
  return;
}

Assistant:

void h264e_dpb_build_list(H264eDpb *dpb, EncCpbStatus *cpb)
{
    RK_S32 i, j;
    RK_S32 st_size = 0;
    RK_S32 lt_size = 0;

    h264e_dbg_dpb("enter %p\n", dpb);

    /* clear list */
    memset(dpb->list, 0, sizeof(dpb->list));

    if (cpb->curr.is_intra) {
        h264e_dbg_dpb("leave %p\n", dpb);
        return ;
    }

    // 2.1 init list
    // 2.1.1 found all short term and long term ref
    h264e_dbg_list("cpb init scaning start\n");

    for (i = 0; i < MAX_CPB_REFS; i++) {
        EncFrmStatus *frm = &cpb->init[i];

        if (!frm->valid)
            continue;

        mpp_assert(!frm->is_non_ref);

        h264e_dbg_list("idx %d frm %d valid %d is_non_ref %d lt_ref %d\n",
                       i, frm->seq_idx, frm->valid, frm->is_non_ref, frm->is_lt_ref);

        H264eDpbFrm *p = find_cpb_frame(dpb, frm);
        if (!frm->is_lt_ref) {
            dpb->stref[st_size++] = p;
            p->status.val = frm->val;
            h264e_dbg_list("found st %d st_size %d %p\n", i, st_size, frm);
        } else {
            dpb->ltref[lt_size++] = p;
            p->status.val = frm->val;
            h264e_dbg_list("found lt %d lt_size %d %p\n", i, lt_size, frm);
        }
    }

    h264e_dbg_list("cpb init scaning done\n");
    h264e_dbg_dpb("dpb_size %d st_size %d lt_size %d\n", dpb->dpb_size, st_size, lt_size);

    // sort st list
    if (st_size > 1) {
        if (h264e_debug & H264E_DBG_LIST) {
            mpp_log_f("dpb st list before sort\n");
            h264e_dpb_dump_listX(dpb->stref, st_size);
        }

        qsort(dpb->stref, st_size, sizeof(dpb->stref[0]), cmp_st_list);

        if (h264e_debug & H264E_DBG_LIST) {
            mpp_log_f("dpb st list after  sort\n");
            h264e_dpb_dump_listX(dpb->stref, st_size);
        }
    }

    if (lt_size > 1) {
        if (h264e_debug & H264E_DBG_LIST) {
            mpp_log_f("dpb lt list before sort\n");
            h264e_dpb_dump_listX(dpb->ltref, lt_size);
        }

        qsort(dpb->ltref, lt_size, sizeof(dpb->ltref[0]), cmp_lt_list);

        if (h264e_debug & H264E_DBG_LIST) {
            mpp_log_f("dpb lt list after  sort\n");
            h264e_dpb_dump_listX(dpb->ltref, lt_size);
        }
    }

    // generate list before reorder
    memset(dpb->list, 0, sizeof(dpb->list));
    j = 0;
    for (i = 0; i < st_size; i++)
        dpb->list[j++] = dpb->stref[i];

    for (i = 0; i < lt_size; i++)
        dpb->list[j++] = dpb->ltref[i];

    dpb->st_size = st_size;
    dpb->lt_size = lt_size;

    mpp_assert(dpb->dpb_size >= st_size + lt_size);

    if (h264e_debug & H264E_DBG_LIST)
        h264e_dpb_dump_list(dpb);

    /* generate syntax */
    h264e_reorder_wr_rewind(dpb->reorder);

    if (dpb->st_size + dpb->lt_size) {
        H264eDpbFrm *curr = dpb->curr;
        H264eDpbFrm *refr = dpb->refr;
        H264eDpbFrm *def_ref = dpb->list[0];

        RK_S32 curr_frm_cnt = curr->status.seq_idx;
        RK_S32 set_ref_frm_cnt = refr->status.seq_idx;
        RK_S32 def_ref_frm_cnt = def_ref->status.seq_idx;

        h264e_dbg_list("refer curr %d def %d set %d reorder %d\n",
                       curr_frm_cnt, def_ref_frm_cnt, set_ref_frm_cnt,
                       (def_ref_frm_cnt != set_ref_frm_cnt));

        if (def_ref_frm_cnt != set_ref_frm_cnt) {
            H264eRplmo op;

            h264e_dbg_list("reorder to frm %d\n", refr->status.seq_idx);

            mpp_assert(!refr->status.is_non_ref);

            op.modification_of_pic_nums_idc = (refr->status.is_lt_ref) ? (2) : (0);
            if (refr->status.is_lt_ref) {
                op.modification_of_pic_nums_idc = 2;
                op.long_term_pic_idx = refr->status.lt_idx;

                h264e_dbg_list("reorder lt idx %d \n", op.long_term_pic_idx);
            } else {
                op.modification_of_pic_nums_idc = curr->frame_num > refr->frame_num ? 0 : 1;
                op.abs_diff_pic_num_minus1 = MPP_ABS(curr->frame_num - refr->frame_num) - 1;

                h264e_dbg_list("reorder st cur %d refr %d diff - 1 %d\n",
                               curr->frame_num, refr->frame_num,
                               op.abs_diff_pic_num_minus1);
            }

            h264e_reorder_wr_op(dpb->reorder, &op);
        }
    } else {
        h264e_dbg_list("refer NULL\n");
    }

    h264e_dbg_dpb("leave %p\n", dpb);
}